

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddy.h
# Opt level: O2

Contents __thiscall
snmalloc::
Buddy<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_4UL,_14UL>
::add_block(Buddy<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_4UL,_14UL>
            *this,Contents addr,size_t size)

{
  size_t sVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
  *root;
  RBPath local_820;
  
  while (bVar3 = remove_buddy(this,addr,size), bVar3) {
    sVar1 = size * 2;
    addr.unsafe_capptr = addr.unsafe_capptr & size * -2;
    size = sVar1;
    if (sVar1 == 0x4000) {
      return (Contents)addr.unsafe_capptr;
    }
  }
  uVar5 = 0x3f;
  if (size - 1 != 0) {
    for (; size - 1 >> uVar5 == 0; uVar5 = uVar5 - 1) {
    }
  }
  lVar6 = -4;
  if (size != 1) {
    lVar6 = (uVar5 ^ 0xffffffffffffffc0) + 0x3d;
  }
  uVar5 = lVar6 + 1U;
  if (lVar6 + 1U < this->empty_at_or_above) {
    uVar5 = this->empty_at_or_above;
  }
  this->empty_at_or_above = uVar5;
  lVar2 = -8;
  do {
    lVar4 = lVar2;
    if (lVar4 == 0x10) {
      root = &(this->entries)._M_elems[lVar6].tree;
      RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
      ::RBPath::RBPath(&local_820,(Handle)root);
      RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
      ::find(root,&local_820,(K)addr.unsafe_capptr);
      RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
      ::insert_path(root,&local_820,(K)addr.unsafe_capptr);
      return (Contents)
             (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
              *)0x0;
    }
    lVar2 = lVar4 + 8;
  } while (*(long *)((long)&(this->entries)._M_elems[lVar6].cache[1].unsafe_capptr + lVar4) != 0);
  *(FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
    **)((long)&(this->entries)._M_elems[lVar6].cache[1].unsafe_capptr + lVar4) = addr.unsafe_capptr;
  return (Contents)
         (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
          *)0x0;
}

Assistant:

typename Rep::Contents add_block(typename Rep::Contents addr, size_t size)
    {
      validate_block(addr, size);

      if (remove_buddy(addr, size))
      {
        // Add to next level cache
        size *= 2;
        addr = Rep::align_down(addr, size);
        if (size == bits::one_at_bit(MAX_SIZE_BITS))
        {
          // Invariant should be checked on all non-tail return paths.
          // Holds trivially here with current design.
          invariant();
          // Too big for this buddy allocator.
          return addr;
        }
        return add_block(addr, size);
      }

      auto idx = to_index(size);
      empty_at_or_above = bits::max(empty_at_or_above, idx + 1);

      for (auto& e : entries[idx].cache)
      {
        if (Rep::equal(Rep::null, e))
        {
          e = addr;
          return Rep::null;
        }
      }

      auto path = entries[idx].tree.get_root_path();
      entries[idx].tree.find(path, addr);
      entries[idx].tree.insert_path(path, addr);
      invariant();
      return Rep::null;
    }